

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

ARKRhsFn arkStep_GetImplicitRHS(void *arkode_mem)

{
  int iVar1;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  ARKRhsFn local_8;
  
  iVar1 = arkStep_AccessStepMem
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (ARKodeARKStepMem *)0xe89e14);
  if (iVar1 == 0) {
    local_8 = *(ARKRhsFn *)(in_stack_ffffffffffffffe0 + 8);
  }
  else {
    local_8 = (ARKRhsFn)0x0;
  }
  return local_8;
}

Assistant:

ARKRhsFn arkStep_GetImplicitRHS(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure, and return fi */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_GetImplicitRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(NULL);
  return(step_mem->fi);
}